

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::gga_screening_interface<ExchCXX::BuiltinB88>::eval_exc_polar
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double sigma_aa_00;
  double in_XMM1_Qa;
  double in_XMM3_Qa;
  double sigma_tol_sq;
  double rho_s;
  double *in_stack_000001f8;
  double in_stack_00000200;
  double in_stack_00000208;
  double in_stack_00000210;
  double in_stack_00000218;
  double in_stack_00000220;
  double in_stack_ffffffffffffffb8;
  double dVar1;
  
  if (1e-25 < in_XMM0_Qa + in_XMM1_Qa) {
    dVar1 = 2.1544346900319022e-67;
    safe_max<double>(2.1544346900319022e-67,in_stack_ffffffffffffffb8);
    safe_max<double>(dVar1,in_stack_ffffffffffffffb8);
    sigma_aa_00 = safe_max<double>(dVar1,in_stack_ffffffffffffffb8);
    dVar1 = safe_max<double>(dVar1,in_stack_ffffffffffffffb8);
    enforce_polar_sigma_constraints<double>(sigma_aa_00,in_XMM3_Qa,dVar1);
    kernel_traits<ExchCXX::BuiltinB88>::eval_exc_polar_impl
              (in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
               in_stack_00000200,in_stack_000001f8);
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double sigma_aa, 
      double sigma_ab, double sigma_bb, double& eps ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    if( rho_s <= traits::dens_tol ) {
      eps = 0.;
    } else {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      rho_a    = safe_max(rho_a, traits::dens_tol);
      rho_b    = safe_max(rho_b, traits::dens_tol);
      sigma_aa = safe_max(sigma_aa, sigma_tol_sq); 
      sigma_bb = safe_max(sigma_bb, sigma_tol_sq); 
      sigma_ab = enforce_polar_sigma_constraints(sigma_aa, sigma_ab, sigma_bb);
      traits::eval_exc_polar_impl( rho_a, rho_b, sigma_aa, sigma_ab,
        sigma_bb, eps );
    }

  }